

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.cpp
# Opt level: O3

Image * rw::readPNG(char *filename)

{
  uint uVar1;
  uint8 *puVar2;
  Image *this;
  size_t __n;
  uint32 h;
  uint32 w;
  uint8 *raw;
  uint32 length;
  LodePNGState state;
  uint local_228;
  uint local_224;
  uchar *local_220;
  uint local_214;
  LodePNGState local_210;
  
  puVar2 = getFileContents(filename,&local_214);
  lodepng_state_init(&local_210);
  local_220 = (uint8 *)0x0;
  local_210.decoder.color_convert = 0;
  uVar1 = lodepng_decode(&local_220,&local_224,&local_228,&local_210,puVar2,(ulong)local_214);
  if (uVar1 != 0) {
    readPNG((rw *)(ulong)uVar1);
    return (Image *)0x0;
  }
  if (local_210.info_raw.colortype == LCT_PALETTE && local_210.info_raw.bitdepth == 4) {
    this = Image::create(local_224,local_228,4);
    Image::allocate(this);
    memcpy(this->palette,local_210.info_raw.palette,local_210.info_raw.palettesize << 2);
    expandPal4_BE(this->pixels,this->stride,local_220,local_224 >> 1,local_224,local_228);
    goto LAB_00110706;
  }
  if (local_210.info_raw.bitdepth != 8) {
    this = (Image *)0x0;
    goto LAB_00110706;
  }
  if (local_210.info_raw.colortype == LCT_RGB) {
    this = Image::create(local_224,local_228,0x18);
    Image::allocate(this);
    puVar2 = this->pixels;
    __n = (size_t)(local_224 * local_228 * 3);
  }
  else {
    if (local_210.info_raw.colortype != LCT_RGBA) {
      if (local_210.info_raw.colortype == LCT_PALETTE) {
        this = Image::create(local_224,local_228,
                             (uint)(0x10 < local_210.info_raw.palettesize) * 4 + 4);
        Image::allocate(this);
        memcpy(this->palette,local_210.info_raw.palette,local_210.info_raw.palettesize << 2);
        puVar2 = this->pixels;
        __n = (size_t)(local_228 * local_224);
        goto LAB_00110701;
      }
      free(local_220);
      lodepng_state_init(&local_210);
      uVar1 = lodepng_decode(&local_220,&local_224,&local_228,&local_210,puVar2,(ulong)local_214);
      if (uVar1 != 0) {
        readPNG((rw *)(ulong)uVar1);
        return (Image *)0x0;
      }
    }
    this = Image::create(local_224,local_228,0x20);
    Image::allocate(this);
    puVar2 = this->pixels;
    __n = (size_t)(local_224 * local_228 * 4);
  }
LAB_00110701:
  memcpy(puVar2,local_220,__n);
LAB_00110706:
  free(local_220);
  return this;
}

Assistant:

Image*
readPNG(const char *filename)
{
	Image *image = nil;
	uint32 length;
	uint8 *data = getFileContents(filename, &length);
	assert(data != nil);

	LodePNGState state;
	lodepng_state_init(&state);
	uint8 *raw = nil;
	uint32 w, h;

	// First try: decode without conversion to see if we understand the format
	state.decoder.color_convert = 0;
	uint32 error = lodepng_decode(&raw, &w, &h, &state, data, length);
	if(error){
		RWERROR((ERR_GENERAL, lodepng_error_text(error)));
		return nil;
	}

	if(state.info_raw.bitdepth == 4 && state.info_raw.colortype == LCT_PALETTE){
		image = Image::create(w, h, 4);
		image->allocate();
		memcpy(image->palette, state.info_raw.palette, state.info_raw.palettesize*4);
		expandPal4_BE(image->pixels, image->stride, raw, w/2, w, h);
	}else if(state.info_raw.bitdepth == 8){
		switch(state.info_raw.colortype){
		case LCT_PALETTE:
			image = Image::create(w, h, state.info_raw.palettesize <= 16 ? 4 : 8);
			image->allocate();
			memcpy(image->palette, state.info_raw.palette, state.info_raw.palettesize*4);
			memcpy(image->pixels, raw, w*h);
			break;
		case LCT_RGB:
			image = Image::create(w, h, 24);
			image->allocate();
			memcpy(image->pixels, raw, w*h*3);
			break;
		default:
			// Second try: just load as 32 bit
			free(raw);
			lodepng_state_init(&state);
			error = lodepng_decode(&raw, &w, &h, &state, data, length);
			if(error){
				RWERROR((ERR_GENERAL, lodepng_error_text(error)));
				return nil;
			}
			// fall through
		case LCT_RGBA:
			image = Image::create(w, h, 32);
			image->allocate();
			memcpy(image->pixels, raw, w*h*4);
			break;
		}
	}

	free(raw);	// TODO: maybe override lodepng allocator

	return image;
}